

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON__UINT_PTR * __thiscall ON_SubDHeap::AllocateArray(ON_SubDHeap *this,size_t *capacity)

{
  ulong uVar1;
  undefined8 *puVar2;
  size_t requested_capacity;
  ON__UINT_PTR *a;
  size_t *capacity_local;
  ON_SubDHeap *this_local;
  
  uVar1 = *capacity;
  if (uVar1 == 0) {
    this_local = (ON_SubDHeap *)0x0;
  }
  else if (uVar1 < 5) {
    puVar2 = (undefined8 *)ON_FixedSizePool::AllocateElement(&this->m_fsp5);
    this_local = (ON_SubDHeap *)(puVar2 + 1);
    *puVar2 = 4;
    *capacity = 4;
  }
  else if (uVar1 < 9) {
    puVar2 = (undefined8 *)ON_FixedSizePool::AllocateElement(&this->m_fsp9);
    this_local = (ON_SubDHeap *)(puVar2 + 1);
    *puVar2 = 8;
    *capacity = 8;
  }
  else if (uVar1 < 0x11) {
    puVar2 = (undefined8 *)ON_FixedSizePool::AllocateElement(&this->m_fsp17);
    this_local = (ON_SubDHeap *)(puVar2 + 1);
    *puVar2 = 0x10;
    *capacity = 0x10;
  }
  else {
    this_local = (ON_SubDHeap *)AllocateOversizedElement(this,capacity);
  }
  return (ON__UINT_PTR *)this_local;
}

Assistant:

ON__UINT_PTR* ON_SubDHeap::AllocateArray(size_t* capacity)
{
  ON__UINT_PTR* a;
  size_t requested_capacity = *capacity;
  if (requested_capacity <= 0)
    return nullptr;

  if (requested_capacity <= 4)
  {
    a = (ON__UINT_PTR*)m_fsp5.AllocateElement();
    *a++ = 4;
    *capacity = 4;
    return a;
  }

  if (requested_capacity <= 8)
  {
    a = (ON__UINT_PTR*)m_fsp9.AllocateElement();
    *a++ = 8;
    *capacity = 8;
    return a;
  }

  if (requested_capacity <= 16)
  {
    a = (ON__UINT_PTR*)m_fsp17.AllocateElement();
    *a++ = 16;
    *capacity = 16;
    return a;
  }

  return  AllocateOversizedElement(capacity);
}